

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc.cpp
# Opt level: O0

Sexp * __thiscall GcHeap::GcHeapImpl::Allocate(GcHeapImpl *this,bool should_finalize)

{
  value_type local_30;
  uint8_t *local_28;
  uint8_t *bump;
  uint8_t *result;
  GcHeapImpl *pGStack_10;
  bool should_finalize_local;
  GcHeapImpl *this_local;
  
  result._7_1_ = should_finalize;
  pGStack_10 = this;
  SignalContractViolation(NoGc,"Allocate");
  bump = this->free;
  local_28 = bump + 0x20;
  if ((this->top < local_28) || ((this->stress & 1U) != 0)) {
    DebugLog("bump pointer alloc failed, triggering a GC");
    Collect(this);
    bump = this->free;
    local_28 = bump + 0x20;
    if (this->top < local_28) {
      PanicImpl("/workspace/llm4binary/github/license_all_cmakelists_25/swgillespie[P]jet/src/gc.cpp"
                ,200,"Allocate","out of memory!");
    }
  }
  DebugLog("allocated object at %p, new bump at %p",bump,local_28);
  this->free = local_28;
  memset(bump,0,0x20);
  if ((result._7_1_ & 1) != 0) {
    DebugLog("marking object %p for finalization",bump);
    local_30 = (value_type)bump;
    std::__cxx11::list<Sexp_*,_std::allocator<Sexp_*>_>::push_back(&this->finalize_queue,&local_30);
  }
  return (Sexp *)bump;
}

Assistant:

Sexp *Allocate(bool should_finalize) {
    // on a debug build, this triggers a stackwalk which will assert if
    // any of the calling functions has a FORBID_GC contract.
    CONTRACT_VIOLATIONS { PERFORMS_GC; }